

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataDB.cpp
# Opt level: O2

void __thiscall
cali::CaliperMetadataDB::CaliperMetadataDBImpl::CaliperMetadataDBImpl(CaliperMetadataDBImpl *this)

{
  _Rb_tree_header *p_Var1;
  Attribute AVar2;
  allocator<char> local_51;
  string local_50;
  
  (this->m_root).super_LockfreeIntrusiveTree<cali::Node>.m_me = &this->m_root;
  (this->m_root).super_LockfreeIntrusiveTree<cali::Node>.m_node = 0x18;
  (this->m_root).m_id = 0xffffffffffffffff;
  (this->m_root).m_treenode.parent = (Node *)0x0;
  (this->m_root).m_treenode.next = (Node *)0x0;
  (this->m_root).m_treenode.head._M_b._M_p = (__pointer_type)0x0;
  (this->m_root).m_attribute = 0xffffffffffffffff;
  (this->m_root).m_data.m_v.type_and_size = 0;
  (this->m_root).m_data.m_v.value.v_uint = 0;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_attributes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&this->m_nodes,0,0x90);
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_attr_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_attr_aliases)._M_t._M_impl.super__Rb_tree_header;
  (this->m_attr_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&(this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xb0);
  (this->m_attr_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_attr_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_attr_aliases)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_attr_units)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_attr_units)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_attr_units)._M_t._M_impl.super__Rb_tree_header;
  (this->m_attr_units)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_attr_units)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_attr_units)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_alias_attr).m_node = (Node *)0x0;
  (this->m_unit_attr).m_node = (Node *)0x0;
  setup_bootstrap_nodes(this);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"attribute.alias",&local_51);
  AVar2 = create_attribute(this,&local_50,CALI_TYPE_STRING,0x40,0,(Attribute *)0x0,(Variant *)0x0);
  (this->m_alias_attr).m_node = AVar2.m_node;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"attribute.unit",&local_51);
  AVar2 = create_attribute(this,&local_50,CALI_TYPE_STRING,0x40,0,(Attribute *)0x0,(Variant *)0x0);
  (this->m_unit_attr).m_node = AVar2.m_node;
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

CaliperMetadataDBImpl() : m_root { CALI_INV_ID, CALI_INV_ID, {} }
    {
        setup_bootstrap_nodes();

        m_alias_attr =
            create_attribute("attribute.alias", CALI_TYPE_STRING, CALI_ATTR_SKIP_EVENTS, 0, nullptr, nullptr);
        m_unit_attr = create_attribute("attribute.unit", CALI_TYPE_STRING, CALI_ATTR_SKIP_EVENTS, 0, nullptr, nullptr);
    }